

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colRope.c
# Opt level: O1

int Utf8CopyDataProc(size_t index,size_t length,size_t number,Col_RopeChunk *chunks,
                    Col_ClientData clientData)

{
  Col_StringFormat CVar1;
  Col_Char c;
  Col_Char1 *pCVar2;
  Col_Char *pCVar3;
  CopyDataInfo *info;
  Col_Char *data;
  
  if (length != 0) {
    data = (Col_Char *)chunks->data;
    do {
      CVar1 = chunks->format;
      c = 0xffffffff;
      if ((int)CVar1 < 4) {
        if (CVar1 == COL_UCS1) {
          c = (Col_Char)(byte)*data;
        }
        else if (CVar1 == COL_UCS2) {
          c = (Col_Char)(ushort)*data;
        }
      }
      else if (CVar1 == COL_UCS4) {
        c = *data;
      }
      else if (CVar1 == COL_UTF8) {
        c = Col_Utf8Get((Col_Char1 *)data);
      }
      else if (CVar1 == COL_UTF16) {
        c = Col_Utf16Get((Col_Char2 *)data);
      }
      pCVar2 = Col_Utf8Set(*clientData,c);
      *(Col_Char1 **)clientData = pCVar2;
      CVar1 = chunks->format;
      if ((int)CVar1 < 4) {
        if (CVar1 == COL_UCS1) {
          pCVar3 = (Col_Char *)((long)data + 1);
        }
        else {
          pCVar3 = (Col_Char *)0x0;
          if (CVar1 == COL_UCS2) {
            pCVar3 = (Col_Char *)((long)data + 2);
          }
        }
      }
      else if (CVar1 == COL_UCS4) {
        pCVar3 = data + 1;
      }
      else if (CVar1 == COL_UTF8) {
        pCVar3 = (Col_Char *)Col_Utf8Next((Col_Char1 *)data);
      }
      else {
        pCVar3 = (Col_Char *)0x0;
        if (CVar1 == COL_UTF16) {
          pCVar3 = (Col_Char *)Col_Utf16Next((Col_Char2 *)data);
        }
      }
      length = length - 1;
      data = pCVar3;
    } while (length != 0);
  }
  return 0;
}

Assistant:

static int
Utf8CopyDataProc(
    size_t index,                   /*!< Rope-relative index where chunks
                                         begin. */
    size_t length,                  /*!< Length of chunks. */
    size_t number,                  /*!< Number of chunks. Always 1. */
    const Col_RopeChunk *chunks,    /*!< Array of chunks. First chunk never
                                         NULL. */

    /*! [in,out] Points to #CopyDataInfo. */
    Col_ClientData clientData)
{
    CopyDataInfo *info = (CopyDataInfo *) clientData;
    const char *p = (const char *) chunks->data;
    Col_Char c;
    size_t i;

    ASSERT(number == 1);

    for (i = 0; i < length; i++, COL_CHAR_NEXT(chunks->format, p)) {
        c = COL_CHAR_GET(chunks->format, p);
        info->data = (char *) Col_Utf8Set((Col_Char1 *) info->data, c);
    }
    return 0;
}